

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# moc_datetimepicker.cpp
# Opt level: O2

void QtMWidgets::DateTimePicker::qt_static_metacall(QObject *_o,Call _c,int _id,void **_a)

{
  TimeSpec *pTVar1;
  undefined4 *puVar2;
  code *pcVar3;
  long lVar4;
  undefined8 uVar5;
  QTime QVar6;
  undefined8 in_RAX;
  time_t tVar7;
  QDate QVar8;
  QDateTime *dt;
  undefined8 local_18;
  
  if (IndexOfMethod < _c) {
    return;
  }
  switch(_c) {
  case InvokeMetaMethod:
    switch(_id) {
    case 0:
      dateTimeChanged((DateTimePicker *)_o,(QDateTime *)_a[1]);
      return;
    case 1:
      timeChanged((DateTimePicker *)_o,(QTime *)_a[1]);
      return;
    case 2:
      dateChanged((DateTimePicker *)_o,(QDate *)_a[1]);
      return;
    case 3:
      dt = (QDateTime *)_a[1];
switchD_00161d68_caseD_0:
      setDateTime((DateTimePicker *)_o,dt);
      return;
    case 4:
      dt = (QDateTime *)_a[1];
switchD_00161d68_caseD_1:
      setDate((DateTimePicker *)_o,(QDate *)dt);
      return;
    case 5:
      dt = (QDateTime *)_a[1];
switchD_00161d68_caseD_2:
      setTime((DateTimePicker *)_o,(QTime *)dt);
      return;
    case 6:
      _q_scroll((DateTimePicker *)_o,*_a[1],*_a[2]);
      return;
    case 7:
      _q_scrollAboutToStart((DateTimePicker *)_o);
      return;
    case 8:
      _q_scrollFinished((DateTimePicker *)_o);
      return;
    }
    break;
  case ReadProperty:
    if (9 < (uint)_id) {
      return;
    }
    pTVar1 = (TimeSpec *)*_a;
    local_18 = in_RAX;
    switch(_id) {
    case 0:
      dateTime((DateTimePicker *)&stack0xffffffffffffffe8);
      goto LAB_00161fa6;
    case 1:
      QVar8 = date((DateTimePicker *)_o);
      goto LAB_00161fe2;
    case 2:
      tVar7 = time((DateTimePicker *)_o,
                   (time_t *)
                   ((long)&switchD_00161d1c::switchdataD_001872ec +
                   (long)(int)(&switchD_00161d1c::switchdataD_001872ec)[_c]));
      QVar6.mds = (int)tVar7;
      break;
    case 3:
      maximumDateTime((DateTimePicker *)&stack0xffffffffffffffe8);
      goto LAB_00161fa6;
    case 4:
      minimumDateTime((DateTimePicker *)&stack0xffffffffffffffe8);
LAB_00161fa6:
      uVar5 = *(undefined8 *)pTVar1;
      *(undefined8 *)pTVar1 = local_18;
      local_18 = uVar5;
      QDateTime::~QDateTime((QDateTime *)&stack0xffffffffffffffe8);
      return;
    case 5:
      QVar8 = maximumDate((DateTimePicker *)_o);
      goto LAB_00161fe2;
    case 6:
      QVar8 = minimumDate((DateTimePicker *)_o);
LAB_00161fe2:
      *(qint64 *)pTVar1 = QVar8.jd;
      return;
    case 7:
      QVar6 = maximumTime((DateTimePicker *)_o);
      break;
    case 8:
      QVar6 = minimumTime((DateTimePicker *)_o);
      break;
    case 9:
      QVar6.mds = timeSpec((DateTimePicker *)_o);
    }
    *pTVar1 = QVar6.mds;
    break;
  case WriteProperty:
    if ((uint)_id < 10) {
      dt = (QDateTime *)*_a;
      switch(_id) {
      case 1:
        goto switchD_00161d68_caseD_1;
      case 2:
        goto switchD_00161d68_caseD_2;
      case 3:
        setMaximumDateTime((DateTimePicker *)_o,dt);
        return;
      case 4:
        setMinimumDateTime((DateTimePicker *)_o,dt);
        return;
      case 5:
        setMaximumDate((DateTimePicker *)_o,(QDate *)dt);
        return;
      case 6:
        setMinimumDate((DateTimePicker *)_o,(QDate *)dt);
        return;
      case 7:
        setMaximumTime((DateTimePicker *)_o,(QTime *)dt);
        return;
      case 8:
        setMinimumTime((DateTimePicker *)_o,(QTime *)dt);
        return;
      case 9:
        setTimeSpec((DateTimePicker *)_o,*(TimeSpec *)dt);
        return;
      }
      goto switchD_00161d68_caseD_0;
    }
    break;
  case ResetProperty:
    switch(_id) {
    case 3:
      clearMaximumDateTime((DateTimePicker *)_o);
      return;
    case 4:
      clearMinimumDateTime((DateTimePicker *)_o);
      return;
    case 5:
      clearMaximumDate((DateTimePicker *)_o);
      return;
    case 6:
      clearMinimumDate((DateTimePicker *)_o);
      return;
    case 7:
      clearMaximumTime((DateTimePicker *)_o);
      return;
    case 8:
      clearMinimumTime((DateTimePicker *)_o);
      return;
    }
    break;
  case IndexOfMethod:
    puVar2 = (undefined4 *)*_a;
    pcVar3 = *_a[1];
    lVar4 = *(long *)((long)_a[1] + 8);
    if (pcVar3 == dateTimeChanged && lVar4 == 0) {
      *puVar2 = 0;
    }
    else if (pcVar3 == timeChanged && lVar4 == 0) {
      *puVar2 = 1;
    }
    else if (pcVar3 == dateChanged && lVar4 == 0) {
      *puVar2 = 2;
    }
  }
  return;
}

Assistant:

void QtMWidgets::DateTimePicker::qt_static_metacall(QObject *_o, QMetaObject::Call _c, int _id, void **_a)
{
    if (_c == QMetaObject::InvokeMetaMethod) {
        auto *_t = static_cast<DateTimePicker *>(_o);
        (void)_t;
        switch (_id) {
        case 0: _t->dateTimeChanged((*reinterpret_cast< std::add_pointer_t<QDateTime>>(_a[1]))); break;
        case 1: _t->timeChanged((*reinterpret_cast< std::add_pointer_t<QTime>>(_a[1]))); break;
        case 2: _t->dateChanged((*reinterpret_cast< std::add_pointer_t<QDate>>(_a[1]))); break;
        case 3: _t->setDateTime((*reinterpret_cast< std::add_pointer_t<QDateTime>>(_a[1]))); break;
        case 4: _t->setDate((*reinterpret_cast< std::add_pointer_t<QDate>>(_a[1]))); break;
        case 5: _t->setTime((*reinterpret_cast< std::add_pointer_t<QTime>>(_a[1]))); break;
        case 6: _t->_q_scroll((*reinterpret_cast< std::add_pointer_t<int>>(_a[1])),(*reinterpret_cast< std::add_pointer_t<int>>(_a[2]))); break;
        case 7: _t->_q_scrollAboutToStart(); break;
        case 8: _t->_q_scrollFinished(); break;
        default: ;
        }
    } else if (_c == QMetaObject::IndexOfMethod) {
        int *result = reinterpret_cast<int *>(_a[0]);
        {
            using _t = void (DateTimePicker::*)(const QDateTime & );
            if (*reinterpret_cast<_t *>(_a[1]) == static_cast<_t>(&DateTimePicker::dateTimeChanged)) {
                *result = 0;
                return;
            }
        }
        {
            using _t = void (DateTimePicker::*)(const QTime & );
            if (*reinterpret_cast<_t *>(_a[1]) == static_cast<_t>(&DateTimePicker::timeChanged)) {
                *result = 1;
                return;
            }
        }
        {
            using _t = void (DateTimePicker::*)(const QDate & );
            if (*reinterpret_cast<_t *>(_a[1]) == static_cast<_t>(&DateTimePicker::dateChanged)) {
                *result = 2;
                return;
            }
        }
    }
#ifndef QT_NO_PROPERTIES
    else if (_c == QMetaObject::ReadProperty) {
        auto *_t = static_cast<DateTimePicker *>(_o);
        (void)_t;
        void *_v = _a[0];
        switch (_id) {
        case 0: *reinterpret_cast< QDateTime*>(_v) = _t->dateTime(); break;
        case 1: *reinterpret_cast< QDate*>(_v) = _t->date(); break;
        case 2: *reinterpret_cast< QTime*>(_v) = _t->time(); break;
        case 3: *reinterpret_cast< QDateTime*>(_v) = _t->maximumDateTime(); break;
        case 4: *reinterpret_cast< QDateTime*>(_v) = _t->minimumDateTime(); break;
        case 5: *reinterpret_cast< QDate*>(_v) = _t->maximumDate(); break;
        case 6: *reinterpret_cast< QDate*>(_v) = _t->minimumDate(); break;
        case 7: *reinterpret_cast< QTime*>(_v) = _t->maximumTime(); break;
        case 8: *reinterpret_cast< QTime*>(_v) = _t->minimumTime(); break;
        case 9: *reinterpret_cast< Qt::TimeSpec*>(_v) = _t->timeSpec(); break;
        default: break;
        }
    } else if (_c == QMetaObject::WriteProperty) {
        auto *_t = static_cast<DateTimePicker *>(_o);
        (void)_t;
        void *_v = _a[0];
        switch (_id) {
        case 0: _t->setDateTime(*reinterpret_cast< QDateTime*>(_v)); break;
        case 1: _t->setDate(*reinterpret_cast< QDate*>(_v)); break;
        case 2: _t->setTime(*reinterpret_cast< QTime*>(_v)); break;
        case 3: _t->setMaximumDateTime(*reinterpret_cast< QDateTime*>(_v)); break;
        case 4: _t->setMinimumDateTime(*reinterpret_cast< QDateTime*>(_v)); break;
        case 5: _t->setMaximumDate(*reinterpret_cast< QDate*>(_v)); break;
        case 6: _t->setMinimumDate(*reinterpret_cast< QDate*>(_v)); break;
        case 7: _t->setMaximumTime(*reinterpret_cast< QTime*>(_v)); break;
        case 8: _t->setMinimumTime(*reinterpret_cast< QTime*>(_v)); break;
        case 9: _t->setTimeSpec(*reinterpret_cast< Qt::TimeSpec*>(_v)); break;
        default: break;
        }
    } else if (_c == QMetaObject::ResetProperty) {
        auto *_t = static_cast<DateTimePicker *>(_o);
        (void)_t;
        switch (_id) {
        case 3: _t->clearMaximumDateTime(); break;
        case 4: _t->clearMinimumDateTime(); break;
        case 5: _t->clearMaximumDate(); break;
        case 6: _t->clearMinimumDate(); break;
        case 7: _t->clearMaximumTime(); break;
        case 8: _t->clearMinimumTime(); break;
        default: break;
        }
    } else if (_c == QMetaObject::BindableProperty) {
    }
#endif // QT_NO_PROPERTIES
}